

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_count.cpp
# Opt level: O0

AggregateFunction * duckdb::RegrCountFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  AggregateFunction *regr_count;
  LogicalType *in_stack_00000098;
  LogicalType *in_stack_000000a0;
  LogicalType *in_stack_000000a8;
  AggregateFunction *pAVar1;
  LogicalType local_68 [40];
  LogicalType local_40 [24];
  LogicalType local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  pAVar1 = in_RDI;
  duckdb::LogicalType::LogicalType(local_28,DOUBLE);
  duckdb::LogicalType::LogicalType(local_40,DOUBLE);
  duckdb::LogicalType::LogicalType(local_68,UINTEGER);
  AggregateFunction::
  BinaryAggregate<unsigned_long,double,double,unsigned_int,duckdb::RegrCountFunction,(duckdb::AggregateDestructorType)0>
            (in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  duckdb::LogicalType::~LogicalType(local_68);
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType(local_28);
  std::__cxx11::string::operator=((string *)&pAVar1->field_0x8,"regr_count");
  pAVar1->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

AggregateFunction RegrCountFun::GetFunction() {
	auto regr_count = AggregateFunction::BinaryAggregate<size_t, double, double, uint32_t, RegrCountFunction>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::UINTEGER);
	regr_count.name = "regr_count";
	regr_count.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return regr_count;
}